

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

void __thiscall
Gudhi::ripser::
Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>_>
::assemble_columns_to_reduce
          (Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>_>
           *this,vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
                 *simplices,
          vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
          *columns_to_reduce,entry_hash_map *pivot_column_index,dimension_t dim)

{
  iterator __position;
  __normal_iterator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>_>
  __first;
  __normal_iterator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>_>
  __last;
  long lVar1;
  pointer pdVar2;
  pointer pdVar3;
  bool bVar4;
  bool bVar5;
  node_pointer ppVar6;
  ulong uVar7;
  diameter_simplex_t *simplex;
  pointer pdVar8;
  diameter_entry_t _simplex;
  diameter_entry_t simplex_00;
  vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
  next_simplices;
  optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
  cofacet;
  pointer local_98;
  iterator iStack_90;
  pointer local_88;
  diameter_simplex_t local_80;
  int local_6c;
  vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t>>
  *local_68;
  undefined1 local_60 [16];
  bool local_50;
  vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
  *local_48;
  pointer local_40;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t,_unsigned_long>_>,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t,_unsigned_long,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::Entry_hash,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::Equal_index>_>
  *local_38;
  
  pdVar8 = (columns_to_reduce->
           super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((columns_to_reduce->
      super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
      )._M_impl.super__Vector_impl_data._M_finish != pdVar8) {
    (columns_to_reduce->
    super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
    )._M_impl.super__Vector_impl_data._M_finish = pdVar8;
  }
  local_98 = (pointer)0x0;
  iStack_90._M_current = (pointer)0x0;
  local_88 = (pointer)0x0;
  pdVar8 = (simplices->
           super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (simplices->
             super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_68 = (vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t>>
              *)columns_to_reduce;
  local_48 = simplices;
  local_38 = &pivot_column_index->table_;
  if (pdVar8 != local_40) {
    local_6c = (int)(char)(dim + -1);
    do {
      _simplex.
      super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
      ._4_4_ = 0;
      _simplex.
      super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
      .first = pdVar8->diameter;
      _simplex.
      super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
      .second.index = pdVar8->index;
      Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
      ::
      Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
      ::set_simplex(&this->cofacets2,_simplex,(dimension_t)local_6c);
      do {
        Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
        ::
        Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
        ::next_raw((optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
                    *)local_60,&this->cofacets2,false);
        bVar4 = local_50;
        if (local_50 == false) break;
        if (dim < this->dim_max) {
          local_80.diameter = (value_t)local_60._0_4_;
          local_80.index = local_60._8_8_;
          if (iStack_90._M_current == local_88) {
            std::
            vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t>>
            ::
            _M_realloc_insert<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t>
                      ((vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t>>
                        *)&local_98,iStack_90,&local_80);
          }
          else {
            *(ulong *)iStack_90._M_current = CONCAT44(local_80._4_4_,local_60._0_4_);
            (iStack_90._M_current)->index = local_60._8_8_;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
        }
        simplex_00.
        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
        ._4_4_ = 0;
        simplex_00.
        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
        .first = (float)local_60._0_4_;
        simplex_00.
        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
        .second.index = local_60._8_8_;
        bVar5 = is_in_zero_apparent_pair(this,simplex_00,dim);
        if (!bVar5) {
          ppVar6 = boost::unordered::detail::
                   table<boost::unordered::detail::map<std::allocator<std::pair<const_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t,_unsigned_long>_>,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t,_unsigned_long,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::Entry_hash,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::Equal_index>_>
                   ::find_node(local_38,(const_key_type *)(local_60 + 8));
          if (ppVar6 == (node_pointer)0x0) {
            local_80.diameter = (value_t)local_60._0_4_;
            local_80.index = local_60._8_8_;
            __position._M_current = *(diameter_simplex_t **)(local_68 + 8);
            if (__position._M_current == *(diameter_simplex_t **)(local_68 + 0x10)) {
              std::
              vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t>>
              ::
              _M_realloc_insert<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t>
                        (local_68,__position,&local_80);
            }
            else {
              *(ulong *)__position._M_current = CONCAT44(local_80._4_4_,local_60._0_4_);
              (__position._M_current)->index = local_60._8_8_;
              *(long *)(local_68 + 8) = *(long *)(local_68 + 8) + 0x10;
            }
          }
        }
      } while (bVar4 != false);
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != local_40);
  }
  if (dim < this->dim_max) {
    pdVar2 = (local_48->
             super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (local_48->
             super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pdVar8 = (local_48->
             super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (local_48->
    super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
    )._M_impl.super__Vector_impl_data._M_start = local_98;
    (local_48->
    super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
    )._M_impl.super__Vector_impl_data._M_finish = iStack_90._M_current;
    (local_48->
    super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = local_88;
    local_98 = pdVar2;
    iStack_90._M_current = pdVar3;
    local_88 = pdVar8;
  }
  __first._M_current = *(diameter_simplex_t **)local_68;
  __last._M_current = *(diameter_simplex_t **)(local_68 + 8);
  if (__first._M_current != __last._M_current) {
    uVar7 = (long)__last._M_current - (long)__first._M_current >> 4;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t*,std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t>>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
                )this);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t*,std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_simplex_t>>>
              (__first,__last,
               (_Iter_comp_iter<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
                )this);
  }
  if (local_98 != (pointer)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return;
}

Assistant:

void assemble_columns_to_reduce(std::vector<diameter_simplex_t>& simplices,
      std::vector<diameter_simplex_t>& columns_to_reduce,
      entry_hash_map& pivot_column_index, dimension_t dim) {

#ifdef GUDHI_INDICATE_PROGRESS
    std::cerr << clear_line << "assembling columns" << std::flush;
    std::chrono::steady_clock::time_point next = std::chrono::steady_clock::now() + time_step;
#endif

    columns_to_reduce.clear();
    std::vector<diameter_simplex_t> next_simplices;

    for (diameter_simplex_t& simplex : simplices) {
      cofacets2.set_simplex(filt.make_diameter_entry(simplex, 1), dim - 1);

      while(true) {
        std::optional<diameter_entry_t> cofacet = cofacets2.next(false);
        if (!cofacet) break;
#ifdef GUDHI_INDICATE_PROGRESS
        if (std::chrono::steady_clock::now() > next) {
          std::cerr << clear_line << "assembling " << next_simplices.size()
            << " columns (processing " << std::distance(&simplices[0], &simplex)
            << "/" << simplices.size() << " simplices)" << std::flush;
          next = std::chrono::steady_clock::now() + time_step;
        }
#endif
        if (dim < dim_max) next_simplices.push_back({get_diameter(*cofacet), filt.get_index(*cofacet)});
        // Wouldn't it be cheaper in the reverse order? Seems negligible
        if (!is_in_zero_apparent_pair(*cofacet, dim) &&
            (pivot_column_index.find(get_entry(*cofacet)) == pivot_column_index.end()))
          columns_to_reduce.push_back({get_diameter(*cofacet), filt.get_index(*cofacet)});
      }
    }

    if (dim < dim_max) simplices.swap(next_simplices);

#ifdef GUDHI_INDICATE_PROGRESS
    std::cerr << clear_line << "sorting " << columns_to_reduce.size() << " columns"
      << std::flush;
#endif

    std::sort(columns_to_reduce.begin(), columns_to_reduce.end(),
        Greater_diameter_or_smaller_index<diameter_simplex_t>(filt));
#ifdef GUDHI_INDICATE_PROGRESS
    std::cerr << clear_line << std::flush;
#endif
  }